

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::projpt2edge(tetgenmesh *this,double *p,double *e1,double *e2,double *prj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = *e1;
  dVar3 = *e2 - dVar1;
  dVar2 = e2[1] - e1[1];
  dVar4 = e2[2] - e1[2];
  dVar6 = SQRT(dVar4 * dVar4 + dVar3 * dVar3 + dVar2 * dVar2);
  dVar5 = (p[2] - e1[2]) * (dVar4 / dVar6) +
          (*p - dVar1) * (dVar3 / dVar6) + (p[1] - e1[1]) * (dVar2 / dVar6);
  *prj = (dVar3 / dVar6) * dVar5 + dVar1;
  prj[1] = (dVar2 / dVar6) * dVar5 + e1[1];
  prj[2] = dVar5 * (dVar4 / dVar6) + e1[2];
  return;
}

Assistant:

void tetgenmesh::projpt2edge(REAL* p, REAL* e1, REAL* e2, REAL* prj)
{
  REAL v1[3], v2[3];
  REAL len, l_p;

  v1[0] = e2[0] - e1[0];
  v1[1] = e2[1] - e1[1];
  v1[2] = e2[2] - e1[2];
  v2[0] = p[0] - e1[0];
  v2[1] = p[1] - e1[1];
  v2[2] = p[2] - e1[2];

  len = sqrt(dot(v1, v1));
  v1[0] /= len;
  v1[1] /= len;
  v1[2] /= len;
  l_p = dot(v1, v2);

  prj[0] = e1[0] + l_p * v1[0];
  prj[1] = e1[1] + l_p * v1[1];
  prj[2] = e1[2] + l_p * v1[2];
}